

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_statusline(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  byte bVar2;
  int iVar3;
  ushort uVar4;
  
  iVar3 = (data->req).httpcode;
  (data->info).httpcode = iVar3;
  bVar2 = conn->httpversion;
  (data->info).httpversion = (uint)bVar2;
  if (bVar2 <= (byte)((data->state).httpversion - 1)) {
    (data->state).httpversion = bVar2;
  }
  if (((data->state).resume_from != 0) && (iVar3 == 0x1a0 && (data->state).httpreq == HTTPREQ_GET))
  {
    puVar1 = &(data->req).field_0xd8;
    *puVar1 = *puVar1 | 8;
  }
  if (conn->httpversion != '\x14') {
    if (conn->httpversion == '\n') {
      Curl_infof(data,"HTTP 1.0, assume close after body");
      Curl_conncontrol(conn,1);
      goto LAB_001266d3;
    }
    if (iVar3 != 0x65 || (data->req).upgr101 != UPGR101_REQUESTED) goto LAB_001266d3;
  }
  conn->bundle->multiuse = 2;
LAB_001266d3:
  iVar3 = (data->req).httpcode;
  uVar4 = (ushort)*(undefined4 *)&(data->req).field_0xd8;
  *(ushort *)&(data->req).field_0xd8 = uVar4 & 0xffef | (ushort)(iVar3 - 100U < 100) << 4;
  if (iVar3 != 0xcc) {
    if (iVar3 != 0x130) {
      return CURLE_OK;
    }
    if ((data->set).timecondition != CURL_TIMECOND_NONE) {
      puVar1 = &(data->info).field_0xe4;
      *puVar1 = *puVar1 | 1;
    }
  }
  (data->req).size = 0;
  (data->req).maxdownload = 0;
  *(ushort *)&(data->req).field_0xd8 = uVar4 | 0x10;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_statusline(struct Curl_easy *data,
                              struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;
  data->info.httpcode = k->httpcode;

  data->info.httpversion = conn->httpversion;
  if(!data->state.httpversion ||
     data->state.httpversion > conn->httpversion)
    /* store the lowest server version we encounter */
    data->state.httpversion = conn->httpversion;

  /*
   * This code executes as part of processing the header.  As a
   * result, it's not totally clear how to interpret the
   * response code yet as that depends on what other headers may
   * be present.  401 and 407 may be errors, but may be OK
   * depending on how authentication is working.  Other codes
   * are definitely errors, so give up here.
   */
  if(data->state.resume_from && data->state.httpreq == HTTPREQ_GET &&
     k->httpcode == 416) {
    /* "Requested Range Not Satisfiable", just proceed and
       pretend this is no error */
    k->ignorebody = TRUE; /* Avoid appending error msg to good data. */
  }

  if(conn->httpversion == 10) {
    /* Default action for HTTP/1.0 must be to close, unless
       we get one of those fancy headers that tell us the
       server keeps it open for us! */
    infof(data, "HTTP 1.0, assume close after body");
    connclose(conn, "HTTP/1.0 close after body");
  }
  else if(conn->httpversion == 20 ||
          (k->upgr101 == UPGR101_REQUESTED && k->httpcode == 101)) {
    DEBUGF(infof(data, "HTTP/2 found, allow multiplexing"));
    /* HTTP/2 cannot avoid multiplexing since it is a core functionality
       of the protocol */
    conn->bundle->multiuse = BUNDLE_MULTIPLEX;
  }
  else if(conn->httpversion >= 11 &&
          !conn->bits.close) {
    /* If HTTP version is >= 1.1 and connection is persistent */
    DEBUGF(infof(data,
                 "HTTP 1.1 or later with persistent connection"));
  }

  k->http_bodyless = k->httpcode >= 100 && k->httpcode < 200;
  switch(k->httpcode) {
  case 304:
    /* (quote from RFC2616, section 10.3.5): The 304 response
     * MUST NOT contain a message-body, and thus is always
     * terminated by the first empty line after the header
     * fields.  */
    if(data->set.timecondition)
      data->info.timecond = TRUE;
    /* FALLTHROUGH */
  case 204:
    /* (quote from RFC2616, section 10.2.5): The server has
     * fulfilled the request but does not need to return an
     * entity-body ... The 204 response MUST NOT include a
     * message-body, and thus is always terminated by the first
     * empty line after the header fields. */
    k->size = 0;
    k->maxdownload = 0;
    k->http_bodyless = TRUE;
    break;
  default:
    break;
  }
  return CURLE_OK;
}